

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O1

spv_result_t
spvTextEncodeOperand
          (AssemblyGrammar *grammar,AssemblyContext *context,spv_operand_type_t type,char *textValue
          ,spv_instruction_t *pInst,spv_operand_pattern_t *pExpectedOperands)

{
  char cVar1;
  Op OVar2;
  iterator __position;
  iterator iVar3;
  pointer puVar4;
  undefined1 auVar5 [12];
  bool bVar6;
  bool bVar7;
  spv_result_t sVar8;
  int iVar9;
  spv_result_t sVar10;
  spv_ext_inst_type_t sVar11;
  char *pcVar12;
  size_t name_len;
  DiagnosticStream *pDVar13;
  IdType *type_00;
  long lVar14;
  uint32_t value;
  spv_operand_desc entry;
  char *opcode_name;
  IdType expected_type;
  char *local_260;
  spv_ext_inst_desc local_258;
  spv_literal_t local_250;
  char *local_220;
  spv_instruction_t *local_218;
  AssemblyContext *local_210;
  undefined1 local_208 [464];
  spv_result_t local_38;
  
  local_260 = textValue;
  if (*textValue == '!') {
    sVar8 = anon_unknown.dwarf_1f7c3c::encodeImmediate(context,textValue,pInst);
    if (sVar8 != SPV_SUCCESS) {
      return sVar8;
    }
    spvAlternatePatternFollowingImmediate((spv_operand_pattern_t *)local_208,pExpectedOperands);
    std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::_M_move_assign
              (pExpectedOperands,(spv_operand_pattern_t *)local_208);
    if ((pointer)local_208._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_208._0_8_,local_208._16_8_ - local_208._0_8_);
    }
    goto LAB_00183f62;
  }
  bVar6 = spvOperandIsOptional(type);
  pcVar12 = local_260;
  if (0x3c < type - SPV_OPERAND_TYPE_ID) {
    if ((type == SPV_OPERAND_TYPE_OPTIONAL_COOPERATIVE_MATRIX_OPERANDS) ||
       (type == SPV_OPERAND_TYPE_OPTIONAL_RAW_ACCESS_CHAIN_OPERANDS))
    goto switchD_001835fb_caseD_23;
switchD_001835fb_caseD_c:
    name_len = strlen(local_260);
    sVar8 = spvtools::AssemblyGrammar::lookupOperand
                      (grammar,type,pcVar12,name_len,(spv_operand_desc *)&local_250);
    if (sVar8 == SPV_SUCCESS) {
      sVar8 = spvtools::AssemblyContext::binaryEncodeU32(context,*(Op *)(local_250._0_8_ + 8),pInst)
      ;
      if (sVar8 == SPV_SUCCESS) {
        spvPushOperandTypes((spv_operand_type_t *)(local_250._0_8_ + 0x1c + 0xc),pExpectedOperands);
        bVar6 = true;
        goto LAB_00183f5e;
      }
    }
    spvtools::AssemblyContext::diagnostic
              ((DiagnosticStream *)local_208,context,SPV_ERROR_INVALID_TEXT);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"Invalid ",8);
    local_258 = (spv_ext_inst_desc)spvOperandTypeStr(type);
    pDVar13 = spvtools::DiagnosticStream::operator<<
                        ((DiagnosticStream *)local_208,(char **)&local_258);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar13," \'",2);
    pDVar13 = spvtools::DiagnosticStream::operator<<(pDVar13,&local_260);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar13,"\'.",2);
    local_38 = pDVar13->error_;
LAB_00183f57:
    context = (AssemblyContext *)(ulong)(uint)local_38;
    spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
LAB_00183f5c:
    bVar6 = false;
LAB_00183f5e:
    sVar10 = (spv_result_t)context;
    goto joined_r0x00183eb6;
  }
  sVar8 = (uint)bVar6 + (uint)bVar6 * 8 + SPV_ERROR_INVALID_TEXT;
  switch(type) {
  case SPV_OPERAND_TYPE_ID:
  case SPV_OPERAND_TYPE_TYPE_ID:
  case SPV_OPERAND_TYPE_RESULT_ID:
  case SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID:
  case SPV_OPERAND_TYPE_SCOPE_ID:
  case SPV_OPERAND_TYPE_FIRST_OPTIONAL_TYPE:
    if (*local_260 != '%') {
      spvtools::AssemblyContext::diagnostic
                ((DiagnosticStream *)local_208,context,SPV_ERROR_INVALID_TEXT);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"Expected id to start with %.",0x1c);
LAB_00183a71:
      spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
      return local_38;
    }
    pcVar12 = local_260 + 1;
    lVar14 = 0;
    local_260 = pcVar12;
LAB_00183707:
    cVar1 = pcVar12[lVar14];
    if (cVar1 != '_') {
      if (cVar1 == '\0') {
        if (lVar14 != 0) {
          local_208._0_4_ = spvtools::AssemblyContext::spvNamedIdAssignOrGet(context,pcVar12);
          if (type == SPV_OPERAND_TYPE_TYPE_ID) {
            pInst->resultTypeId = local_208._0_4_;
          }
          __position._M_current =
               (pInst->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (pInst->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pInst->words,__position
                       ,(uint *)local_208);
          }
          else {
            *__position._M_current = local_208._0_4_;
            (pInst->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          bVar7 = spvIsExtendedInstruction(pInst->opcode);
          bVar6 = true;
          if ((bVar7) &&
             (puVar4 = (pInst->words).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start,
             (long)(pInst->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 == 0x10)) {
            sVar11 = spvtools::AssemblyContext::getExtInstTypeForId(context,puVar4[3]);
            bVar6 = sVar11 != SPV_EXT_INST_TYPE_NONE;
            if (sVar11 == SPV_EXT_INST_TYPE_NONE) {
              spvtools::AssemblyContext::diagnostic
                        ((DiagnosticStream *)local_208,context,SPV_ERROR_INVALID_TEXT);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,"Invalid extended instruction import Id ",0x27);
              std::ostream::_M_insert<unsigned_long>((ulong)local_208);
              context = (AssemblyContext *)(ulong)(uint)local_38;
              spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
            }
            else {
              pInst->extInstType = sVar11;
            }
          }
          sVar10 = (spv_result_t)context;
          break;
        }
LAB_00183a35:
        spvtools::AssemblyContext::diagnostic
                  ((DiagnosticStream *)local_208,context,SPV_ERROR_INVALID_TEXT);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"Invalid ID ",0xb);
        pDVar13 = spvtools::DiagnosticStream::operator<<((DiagnosticStream *)local_208,&local_260);
        local_38 = pDVar13->error_;
        goto LAB_00183a71;
      }
      iVar9 = isalnum((int)cVar1);
      if (iVar9 == 0) goto LAB_00183a35;
    }
    lVar14 = lVar14 + 1;
    goto LAB_00183707;
  case SPV_OPERAND_TYPE_LITERAL_INTEGER:
  case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_INTEGER:
    local_208._8_4_ = kScalarIntegerType;
    goto LAB_00183c9c;
  case SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER:
    sVar8 = spvtools::AssemblyGrammar::lookupExtInst
                      (grammar,pInst->extInstType,local_260,&local_258);
    if (sVar8 == SPV_SUCCESS) {
      spvInstructionAddWord(pInst,local_258->ext_inst);
      spvPushOperandTypes(local_258->operandTypes,pExpectedOperands);
      bVar6 = true;
    }
    else {
      bVar6 = spvExtInstIsNonSemantic(pInst->extInstType);
      if (bVar6) {
        local_250.str._M_string_length = 0;
        local_250.str.field_2._M_local_buf[0] = '\0';
        local_250.str._M_dataplus._M_p = (pointer)((long)&local_250 + 0x20U);
        sVar8 = spvTextToLiteral(local_260,&local_250);
        bVar6 = local_250.type == SPV_LITERAL_TYPE_UINT_32 && sVar8 == SPV_SUCCESS;
        if (local_250.type == SPV_LITERAL_TYPE_UINT_32 && sVar8 == SPV_SUCCESS) {
          spvInstructionAddWord(pInst,local_250.value.u32);
          local_208._0_4_ = 0x34;
          iVar3._M_current =
               (pExpectedOperands->
               super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (pExpectedOperands->
              super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::
            _M_realloc_insert<spv_operand_type_t>
                      (pExpectedOperands,iVar3,(spv_operand_type_t *)local_208);
          }
          else {
            *iVar3._M_current = SPV_OPERAND_TYPE_FIRST_VARIABLE_TYPE;
            (pExpectedOperands->
            super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
        }
        else {
          spvtools::AssemblyContext::diagnostic
                    ((DiagnosticStream *)local_208,context,SPV_ERROR_INVALID_TEXT);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"Couldn\'t translate unknown extended instruction name \'"
                     ,0x36);
          pDVar13 = spvtools::DiagnosticStream::operator<<((DiagnosticStream *)local_208,&local_260)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar13,"\' to unsigned integer.",0x16);
          context = (AssemblyContext *)(ulong)(uint)pDVar13->error_;
          spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
        }
        if (local_250.str._M_dataplus._M_p != (pointer)((long)&local_250 + 0x20U)) {
          operator_delete(local_250.str._M_dataplus._M_p,
                          CONCAT71(local_250.str.field_2._M_allocated_capacity._1_7_,
                                   local_250.str.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        spvtools::AssemblyContext::diagnostic
                  ((DiagnosticStream *)local_208,context,SPV_ERROR_INVALID_TEXT);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"Invalid extended instruction name \'",0x23);
        pDVar13 = spvtools::DiagnosticStream::operator<<((DiagnosticStream *)local_208,&local_260);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar13,"\'.",2);
        context = (AssemblyContext *)(ulong)(uint)pDVar13->error_;
        spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
        bVar6 = false;
      }
    }
    sVar10 = (spv_result_t)context;
    break;
  case SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER:
    sVar8 = spvtools::AssemblyGrammar::lookupSpecConstantOpcode(grammar,local_260,(Op *)&local_258);
    if (sVar8 == SPV_SUCCESS) {
      auVar5._4_8_ = 0;
      auVar5._0_4_ = local_250.value.u32;
      local_250._0_12_ = auVar5 << 0x40;
      sVar8 = spvtools::AssemblyGrammar::lookupOpcode
                        (grammar,(Op)local_258,(spv_opcode_desc *)&local_250);
      bVar6 = sVar8 == SPV_SUCCESS;
      if (bVar6) {
        spvInstructionAddWord(pInst,*(Op *)(local_250._0_8_ + 8));
        if (*(bool *)(local_250._0_8_ + 0x5d) == false) {
          __assert_fail("opcodeEntry->hasType",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/text.cpp"
                        ,0x128,
                        "spv_result_t spvTextEncodeOperand(const spvtools::AssemblyGrammar &, spvtools::AssemblyContext *, const spv_operand_type_t, const char *, spv_instruction_t *, spv_operand_pattern_t *)"
                       );
        }
        if (*(bool *)(local_250._0_8_ + 0x5c) == false) {
          __assert_fail("opcodeEntry->hasResult",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/text.cpp"
                        ,0x129,
                        "spv_result_t spvTextEncodeOperand(const spvtools::AssemblyGrammar &, spvtools::AssemblyContext *, const spv_operand_type_t, const char *, spv_instruction_t *, spv_operand_pattern_t *)"
                       );
        }
        if ((ushort)*(uint32_t *)(local_250._0_8_ + 0x18) < 2) {
          __assert_fail("opcodeEntry->numTypes >= 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/text.cpp"
                        ,0x12a,
                        "spv_result_t spvTextEncodeOperand(const spvtools::AssemblyGrammar &, spvtools::AssemblyContext *, const spv_operand_type_t, const char *, spv_instruction_t *, spv_operand_pattern_t *)"
                       );
        }
        spvPushOperandTypes((spv_operand_type_t *)(local_250._0_8_ + 0x1c + 8),pExpectedOperands);
      }
      else {
        spvtools::AssemblyContext::diagnostic
                  ((DiagnosticStream *)local_208,context,SPV_ERROR_INTERNAL);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"OpSpecConstant opcode table out of sync",0x27);
        context = (AssemblyContext *)(ulong)(uint)local_38;
        spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
      }
    }
    else {
      spvtools::AssemblyContext::diagnostic
                ((DiagnosticStream *)local_208,context,SPV_ERROR_INVALID_TEXT);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"Invalid ",8);
      pcVar12 = spvOperandTypeStr(SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER);
      local_250._0_8_ = pcVar12;
      pDVar13 = spvtools::DiagnosticStream::operator<<
                          ((DiagnosticStream *)local_208,(char **)&local_250);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar13," \'",2);
      pDVar13 = spvtools::DiagnosticStream::operator<<(pDVar13,&local_260);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar13,"\'.",2);
      context = (AssemblyContext *)(ulong)(uint)pDVar13->error_;
      spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
      bVar6 = false;
    }
    sVar10 = (spv_result_t)context;
    break;
  case SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER:
  case SPV_OPERAND_TYPE_OPTIONAL_TYPED_LITERAL_INTEGER:
    local_250._0_12_ = ZEXT812(0);
    OVar2 = pInst->opcode;
    if (OVar2 == OpConstant) {
LAB_001838b4:
      local_250._0_12_ =
           spvtools::AssemblyContext::getTypeOfTypeGeneratingValue(context,pInst->resultTypeId);
      if (local_250.value._0_4_ - kScalarIntegerType < 2) goto LAB_00183d08;
      local_220 = "opcode";
      sVar8 = spvtools::AssemblyGrammar::lookupOpcode
                        (grammar,pInst->opcode,(spv_opcode_desc *)&local_258);
      if (sVar8 == SPV_SUCCESS) {
        local_220 = local_258->name;
      }
      spvtools::AssemblyContext::diagnostic
                ((DiagnosticStream *)local_208,context,SPV_ERROR_INVALID_TEXT);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"Type for ",9);
      pDVar13 = spvtools::DiagnosticStream::operator<<((DiagnosticStream *)local_208,&local_220);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar13," must be a scalar floating point or integer type",0x30);
      local_38 = pDVar13->error_;
      goto LAB_00183f57;
    }
    if (OVar2 == OpSwitch) {
      local_250._0_12_ =
           spvtools::AssemblyContext::getTypeOfValueInstruction
                     (context,(pInst->words).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[1]);
      if (local_250.value._0_4_ != kScalarIntegerType) {
        spvtools::AssemblyContext::diagnostic
                  ((DiagnosticStream *)local_208,context,SPV_ERROR_INVALID_TEXT);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,
                   "The selector operand for OpSwitch must be the result of an instruction that generates an integer scalar"
                   ,0x67);
        goto LAB_00183f57;
      }
    }
    else if (OVar2 == OpSpecConstant) goto LAB_001838b4;
LAB_00183d08:
    sVar8 = spvtools::AssemblyContext::binaryEncodeNumericLiteral
                      (context,local_260,sVar8,(IdType *)&local_250,pInst);
    context = (AssemblyContext *)(ulong)(uint)sVar8;
    bVar6 = sVar8 == SPV_SUCCESS;
    goto LAB_00183f5e;
  case SPV_OPERAND_TYPE_LITERAL_FLOAT:
    local_208._8_4_ = kScalarFloatType;
LAB_00183c9c:
    type_00 = (IdType *)local_208;
    local_208._0_8_ = (pointer)0x20;
LAB_00183ca8:
    sVar10 = spvtools::AssemblyContext::binaryEncodeNumericLiteral
                       (context,local_260,sVar8,type_00,pInst);
    sVar8 = sVar10;
joined_r0x00184159:
    if (sVar8 != SPV_SUCCESS) {
      return sVar10;
    }
    goto LAB_00183f62;
  case SPV_OPERAND_TYPE_LITERAL_STRING:
  case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_STRING:
    bVar6 = false;
    local_250._0_8_ = local_250._4_8_ << 0x20;
    local_250.value.i32 = 0;
    local_250.str._M_string_length = 0;
    local_250.str.field_2._M_local_buf[0] = '\0';
    local_250.str._M_dataplus._M_p = (pointer)((long)&local_250 + 0x20U);
    sVar10 = spvTextToLiteral(local_260,&local_250);
    if (sVar10 != SPV_ERROR_OUT_OF_MEMORY) {
      if (sVar10 == SPV_SUCCESS) {
        if (local_250.type != SPV_LITERAL_TYPE_STRING) {
          spvtools::AssemblyContext::diagnostic
                    ((DiagnosticStream *)local_208,context,SPV_ERROR_INVALID_TEXT);
          pcVar12 = "Expected literal string, found literal number \'";
          lVar14 = 0x2f;
          goto LAB_00183e60;
        }
        if (pInst->opcode != OpExtInstImport) {
LAB_001840f5:
          sVar8 = spvtools::AssemblyContext::binaryEncodeString
                            (context,local_250.str._M_dataplus._M_p,pInst);
          bVar6 = sVar8 == SPV_SUCCESS;
          if (!bVar6) {
            sVar10 = SPV_ERROR_INVALID_TEXT;
          }
          goto LAB_00183e9d;
        }
        sVar11 = spvExtInstImportTypeGet(local_250.str._M_dataplus._M_p);
        if (sVar11 == SPV_EXT_INST_TYPE_NONE) {
          spvtools::AssemblyContext::diagnostic
                    ((DiagnosticStream *)local_208,context,SPV_ERROR_INVALID_TEXT);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"Invalid extended instruction import \'",0x25);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_250.str._M_dataplus._M_p,
                     local_250.str._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"\'",1);
          spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
          bVar6 = false;
          sVar10 = local_38;
        }
        else {
          sVar10 = spvtools::AssemblyContext::recordIdAsExtInstImport
                             (context,(pInst->words).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start[1],sVar11);
          bVar6 = sVar10 == SPV_SUCCESS;
        }
        if (bVar6) goto LAB_001840f5;
      }
      else {
        spvtools::AssemblyContext::diagnostic((DiagnosticStream *)local_208,context,sVar8);
        pcVar12 = "Invalid literal string \'";
        lVar14 = 0x18;
LAB_00183e60:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar12,lVar14);
        pDVar13 = spvtools::DiagnosticStream::operator<<((DiagnosticStream *)local_208,&local_260);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar13,"\'.",2);
        sVar10 = pDVar13->error_;
        spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
      }
      bVar6 = false;
    }
LAB_00183e9d:
    if (local_250.str._M_dataplus._M_p != (pointer)((long)&local_250 + 0x20U)) {
      operator_delete(local_250.str._M_dataplus._M_p,
                      CONCAT71(local_250.str.field_2._M_allocated_capacity._1_7_,
                               local_250.str.field_2._M_local_buf[0]) + 1);
    }
    break;
  default:
    goto switchD_001835fb_caseD_c;
  case SPV_OPERAND_TYPE_IMAGE:
  case SPV_OPERAND_TYPE_FP_FAST_MATH_MODE:
  case SPV_OPERAND_TYPE_SELECTION_CONTROL:
  case SPV_OPERAND_TYPE_LOOP_CONTROL:
  case SPV_OPERAND_TYPE_FUNCTION_CONTROL:
  case SPV_OPERAND_TYPE_OPTIONAL_IMAGE:
  case SPV_OPERAND_TYPE_OPTIONAL_MEMORY_ACCESS:
  case SPV_OPERAND_TYPE_DEBUG_INFO_FLAGS:
  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_INFO_FLAGS:
switchD_001835fb_caseD_23:
    sVar8 = spvtools::AssemblyGrammar::parseMaskOperand
                      (grammar,type,local_260,(uint32_t *)&local_258);
    local_210 = context;
    if (sVar8 == SPV_SUCCESS) {
      sVar8 = spvtools::AssemblyContext::binaryEncodeU32(context,(Op)local_258,pInst);
      context = (AssemblyContext *)((ulong)context & 0xffffffff);
      if (sVar8 != SPV_SUCCESS) {
        context = (AssemblyContext *)(ulong)(uint)sVar8;
        goto LAB_00183f5c;
      }
      spvtools::AssemblyGrammar::pushOperandTypesForMask
                (grammar,type,(Op)local_258,pExpectedOperands);
      bVar6 = true;
      goto LAB_00183f5e;
    }
    local_218 = pInst;
    spvtools::AssemblyContext::diagnostic((DiagnosticStream *)local_208,context,sVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"Invalid ",8);
    pcVar12 = spvOperandTypeStr(type);
    local_250._0_8_ = pcVar12;
    pDVar13 = spvtools::DiagnosticStream::operator<<
                        ((DiagnosticStream *)local_208,(char **)&local_250);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar13," operand \'",10);
    pDVar13 = spvtools::DiagnosticStream::operator<<(pDVar13,&local_260);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar13,"\'.",2);
    context = (AssemblyContext *)(ulong)(uint)pDVar13->error_;
    spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
    goto LAB_00183f5c;
  case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_NUMBER:
    type_00 = (IdType *)&spvtools::kUnknownType;
    goto LAB_00183ca8;
  case SPV_OPERAND_TYPE_OPTIONAL_CIV:
    sVar8 = spvTextEncodeOperand
                      (grammar,context,SPV_OPERAND_TYPE_OPTIONAL_LITERAL_NUMBER,local_260,pInst,
                       pExpectedOperands);
    if (sVar8 == SPV_FAILED_MATCH) {
      sVar8 = spvTextEncodeOperand
                        (grammar,context,SPV_OPERAND_TYPE_OPTIONAL_LITERAL_STRING,local_260,pInst,
                         pExpectedOperands);
    }
    if (sVar8 == SPV_FAILED_MATCH) {
      sVar8 = spvTextEncodeOperand
                        (grammar,context,SPV_OPERAND_TYPE_FIRST_OPTIONAL_TYPE,local_260,pInst,
                         pExpectedOperands);
    }
    if (sVar8 == SPV_SUCCESS) {
      iVar3._M_current =
           (pExpectedOperands->
           super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if ((pExpectedOperands->
          super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl.
          super__Vector_impl_data._M_start == iVar3._M_current) {
        local_208._0_4_ = 0x32;
        if (iVar3._M_current ==
            (pExpectedOperands->
            super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::
          _M_realloc_insert<spv_operand_type_t>
                    (pExpectedOperands,iVar3,(spv_operand_type_t *)local_208);
        }
        else {
          *iVar3._M_current = SPV_OPERAND_TYPE_OPTIONAL_CIV;
          (pExpectedOperands->
          super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
      }
    }
    else {
      spvtools::AssemblyContext::diagnostic((DiagnosticStream *)local_208,context,sVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"Invalid word following !<integer>: ",0x23);
      pDVar13 = spvtools::DiagnosticStream::operator<<((DiagnosticStream *)local_208,&local_260);
      context = (AssemblyContext *)(ulong)(uint)pDVar13->error_;
      spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
    }
    sVar10 = (spv_result_t)context;
    goto joined_r0x00184159;
  }
joined_r0x00183eb6:
  if (bVar6) {
LAB_00183f62:
    sVar10 = SPV_SUCCESS;
  }
  return sVar10;
}

Assistant:

spv_result_t spvTextEncodeOperand(const spvtools::AssemblyGrammar& grammar,
                                  spvtools::AssemblyContext* context,
                                  const spv_operand_type_t type,
                                  const char* textValue,
                                  spv_instruction_t* pInst,
                                  spv_operand_pattern_t* pExpectedOperands) {
  // NOTE: Handle immediate int in the stream
  if ('!' == textValue[0]) {
    if (auto error = encodeImmediate(context, textValue, pInst)) {
      return error;
    }
    *pExpectedOperands =
        spvAlternatePatternFollowingImmediate(*pExpectedOperands);
    return SPV_SUCCESS;
  }

  // Optional literal operands can fail to parse. In that case use
  // SPV_FAILED_MATCH to avoid emitting a diagostic.  Use the following
  // for those situations.
  spv_result_t error_code_for_literals =
      spvOperandIsOptional(type) ? SPV_FAILED_MATCH : SPV_ERROR_INVALID_TEXT;

  switch (type) {
    case SPV_OPERAND_TYPE_ID:
    case SPV_OPERAND_TYPE_TYPE_ID:
    case SPV_OPERAND_TYPE_RESULT_ID:
    case SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID:
    case SPV_OPERAND_TYPE_SCOPE_ID:
    case SPV_OPERAND_TYPE_OPTIONAL_ID: {
      if ('%' == textValue[0]) {
        textValue++;
      } else {
        return context->diagnostic() << "Expected id to start with %.";
      }
      if (!spvIsValidID(textValue)) {
        return context->diagnostic() << "Invalid ID " << textValue;
      }
      const uint32_t id = context->spvNamedIdAssignOrGet(textValue);
      if (type == SPV_OPERAND_TYPE_TYPE_ID) pInst->resultTypeId = id;
      spvInstructionAddWord(pInst, id);

      // Set the extended instruction type.
      // The import set id is the 3rd operand of OpExtInst.
      if (spvIsExtendedInstruction(pInst->opcode) && pInst->words.size() == 4) {
        auto ext_inst_type = context->getExtInstTypeForId(pInst->words[3]);
        if (ext_inst_type == SPV_EXT_INST_TYPE_NONE) {
          return context->diagnostic()
                 << "Invalid extended instruction import Id "
                 << pInst->words[2];
        }
        pInst->extInstType = ext_inst_type;
      }
    } break;

    case SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER: {
      // The assembler accepts the symbolic name for an extended instruction,
      // and emits its corresponding number.
      spv_ext_inst_desc extInst;
      if (grammar.lookupExtInst(pInst->extInstType, textValue, &extInst) ==
          SPV_SUCCESS) {
        // if we know about this extended instruction, push the numeric value
        spvInstructionAddWord(pInst, extInst->ext_inst);

        // Prepare to parse the operands for the extended instructions.
        spvPushOperandTypes(extInst->operandTypes, pExpectedOperands);
      } else {
        // if we don't know this extended instruction and the set isn't
        // non-semantic, we cannot process further
        if (!spvExtInstIsNonSemantic(pInst->extInstType)) {
          return context->diagnostic()
                 << "Invalid extended instruction name '" << textValue << "'.";
        } else {
          // for non-semantic instruction sets, as long as the text name is an
          // integer value we can encode it since we know the form of all such
          // extended instructions
          spv_literal_t extInstValue;
          if (spvTextToLiteral(textValue, &extInstValue) ||
              extInstValue.type != SPV_LITERAL_TYPE_UINT_32) {
            return context->diagnostic()
                   << "Couldn't translate unknown extended instruction name '"
                   << textValue << "' to unsigned integer.";
          }

          spvInstructionAddWord(pInst, extInstValue.value.u32);

          // opcode contains an unknown number of IDs.
          pExpectedOperands->push_back(SPV_OPERAND_TYPE_VARIABLE_ID);
        }
      }
    } break;

    case SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER: {
      // The assembler accepts the symbolic name for the opcode, but without
      // the "Op" prefix.  For example, "IAdd" is accepted.  The number
      // of the opcode is emitted.
      spv::Op opcode;
      if (grammar.lookupSpecConstantOpcode(textValue, &opcode)) {
        return context->diagnostic() << "Invalid " << spvOperandTypeStr(type)
                                     << " '" << textValue << "'.";
      }
      spv_opcode_desc opcodeEntry = nullptr;
      if (grammar.lookupOpcode(opcode, &opcodeEntry)) {
        return context->diagnostic(SPV_ERROR_INTERNAL)
               << "OpSpecConstant opcode table out of sync";
      }
      spvInstructionAddWord(pInst, uint32_t(opcodeEntry->opcode));

      // Prepare to parse the operands for the opcode.  Except skip the
      // type Id and result Id, since they've already been processed.
      assert(opcodeEntry->hasType);
      assert(opcodeEntry->hasResult);
      assert(opcodeEntry->numTypes >= 2);
      spvPushOperandTypes(opcodeEntry->operandTypes + 2, pExpectedOperands);
    } break;

    case SPV_OPERAND_TYPE_LITERAL_INTEGER:
    case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_INTEGER: {
      // The current operand is an *unsigned* 32-bit integer.
      // That's just how the grammar works.
      spvtools::IdType expected_type = {
          32, false, spvtools::IdTypeClass::kScalarIntegerType};
      if (auto error = context->binaryEncodeNumericLiteral(
              textValue, error_code_for_literals, expected_type, pInst)) {
        return error;
      }
    } break;

    case SPV_OPERAND_TYPE_LITERAL_FLOAT: {
      // The current operand is a 32-bit float.
      // That's just how the grammar works.
      spvtools::IdType expected_type = {
          32, false, spvtools::IdTypeClass::kScalarFloatType};
      if (auto error = context->binaryEncodeNumericLiteral(
              textValue, error_code_for_literals, expected_type, pInst)) {
        return error;
      }
    } break;

    case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_NUMBER:
      // This is a context-independent literal number which can be a 32-bit
      // number of floating point value.
      if (auto error = context->binaryEncodeNumericLiteral(
              textValue, error_code_for_literals, spvtools::kUnknownType,
              pInst)) {
        return error;
      }
      break;

    case SPV_OPERAND_TYPE_OPTIONAL_TYPED_LITERAL_INTEGER:
    case SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER: {
      spvtools::IdType expected_type = spvtools::kUnknownType;
      // The encoding for OpConstant, OpSpecConstant and OpSwitch all
      // depend on either their own result-id or the result-id of
      // one of their parameters.
      if (spv::Op::OpConstant == pInst->opcode ||
          spv::Op::OpSpecConstant == pInst->opcode) {
        // The type of the literal is determined by the type Id of the
        // instruction.
        expected_type =
            context->getTypeOfTypeGeneratingValue(pInst->resultTypeId);
        if (!spvtools::isScalarFloating(expected_type) &&
            !spvtools::isScalarIntegral(expected_type)) {
          spv_opcode_desc d;
          const char* opcode_name = "opcode";
          if (SPV_SUCCESS == grammar.lookupOpcode(pInst->opcode, &d)) {
            opcode_name = d->name;
          }
          return context->diagnostic()
                 << "Type for " << opcode_name
                 << " must be a scalar floating point or integer type";
        }
      } else if (pInst->opcode == spv::Op::OpSwitch) {
        // The type of the literal is the same as the type of the selector.
        expected_type = context->getTypeOfValueInstruction(pInst->words[1]);
        if (!spvtools::isScalarIntegral(expected_type)) {
          return context->diagnostic()
                 << "The selector operand for OpSwitch must be the result"
                    " of an instruction that generates an integer scalar";
        }
      }
      if (auto error = context->binaryEncodeNumericLiteral(
              textValue, error_code_for_literals, expected_type, pInst)) {
        return error;
      }
    } break;

    case SPV_OPERAND_TYPE_LITERAL_STRING:
    case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_STRING: {
      spv_literal_t literal = {};
      spv_result_t error = spvTextToLiteral(textValue, &literal);
      if (error != SPV_SUCCESS) {
        if (error == SPV_ERROR_OUT_OF_MEMORY) return error;
        return context->diagnostic(error_code_for_literals)
               << "Invalid literal string '" << textValue << "'.";
      }
      if (literal.type != SPV_LITERAL_TYPE_STRING) {
        return context->diagnostic()
               << "Expected literal string, found literal number '" << textValue
               << "'.";
      }

      // NOTE: Special case for extended instruction library import
      if (spv::Op::OpExtInstImport == pInst->opcode) {
        const spv_ext_inst_type_t ext_inst_type =
            spvExtInstImportTypeGet(literal.str.c_str());
        if (SPV_EXT_INST_TYPE_NONE == ext_inst_type) {
          return context->diagnostic()
                 << "Invalid extended instruction import '" << literal.str
                 << "'";
        }
        if ((error = context->recordIdAsExtInstImport(pInst->words[1],
                                                      ext_inst_type)))
          return error;
      }

      if (context->binaryEncodeString(literal.str.c_str(), pInst))
        return SPV_ERROR_INVALID_TEXT;
    } break;

    // Masks.
    case SPV_OPERAND_TYPE_FP_FAST_MATH_MODE:
    case SPV_OPERAND_TYPE_FUNCTION_CONTROL:
    case SPV_OPERAND_TYPE_LOOP_CONTROL:
    case SPV_OPERAND_TYPE_IMAGE:
    case SPV_OPERAND_TYPE_OPTIONAL_IMAGE:
    case SPV_OPERAND_TYPE_OPTIONAL_MEMORY_ACCESS:
    case SPV_OPERAND_TYPE_OPTIONAL_RAW_ACCESS_CHAIN_OPERANDS:
    case SPV_OPERAND_TYPE_SELECTION_CONTROL:
    case SPV_OPERAND_TYPE_DEBUG_INFO_FLAGS:
    case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_INFO_FLAGS:
    case SPV_OPERAND_TYPE_OPTIONAL_COOPERATIVE_MATRIX_OPERANDS: {
      uint32_t value;
      if (auto error = grammar.parseMaskOperand(type, textValue, &value)) {
        return context->diagnostic(error)
               << "Invalid " << spvOperandTypeStr(type) << " operand '"
               << textValue << "'.";
      }
      if (auto error = context->binaryEncodeU32(value, pInst)) return error;
      // Prepare to parse the operands for this logical operand.
      grammar.pushOperandTypesForMask(type, value, pExpectedOperands);
    } break;
    case SPV_OPERAND_TYPE_OPTIONAL_CIV: {
      auto error = spvTextEncodeOperand(
          grammar, context, SPV_OPERAND_TYPE_OPTIONAL_LITERAL_NUMBER, textValue,
          pInst, pExpectedOperands);
      if (error == SPV_FAILED_MATCH) {
        // It's not a literal number -- is it a literal string?
        error = spvTextEncodeOperand(grammar, context,
                                     SPV_OPERAND_TYPE_OPTIONAL_LITERAL_STRING,
                                     textValue, pInst, pExpectedOperands);
      }
      if (error == SPV_FAILED_MATCH) {
        // It's not a literal -- is it an ID?
        error =
            spvTextEncodeOperand(grammar, context, SPV_OPERAND_TYPE_OPTIONAL_ID,
                                 textValue, pInst, pExpectedOperands);
      }
      if (error) {
        return context->diagnostic(error)
               << "Invalid word following !<integer>: " << textValue;
      }
      if (pExpectedOperands->empty()) {
        pExpectedOperands->push_back(SPV_OPERAND_TYPE_OPTIONAL_CIV);
      }
    } break;
    default: {
      // NOTE: All non literal operands are handled here using the operand
      // table.
      spv_operand_desc entry;
      if (grammar.lookupOperand(type, textValue, strlen(textValue), &entry)) {
        return context->diagnostic() << "Invalid " << spvOperandTypeStr(type)
                                     << " '" << textValue << "'.";
      }
      if (context->binaryEncodeU32(entry->value, pInst)) {
        return context->diagnostic() << "Invalid " << spvOperandTypeStr(type)
                                     << " '" << textValue << "'.";
      }

      // Prepare to parse the operands for this logical operand.
      spvPushOperandTypes(entry->operandTypes, pExpectedOperands);
    } break;
  }
  return SPV_SUCCESS;
}